

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainMakefile2(cmGlobalUnixMakefileGenerator3 *this)

{
  __uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> this_00;
  long *plVar1;
  pointer puVar2;
  pointer pbVar3;
  pointer pbVar4;
  Encoding encoding;
  string *psVar5;
  _Rb_tree_node_base *p_Var6;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen;
  pointer puVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer pbVar9;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  undefined1 local_2f8 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_commands;
  string makefileName;
  cmGeneratedFileStream makefileStream;
  
  psVar5 = cmake::GetHomeOutputDirectory_abi_cxx11_
                     ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance);
  makefileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (psVar5->_M_dataplus)._M_p;
  makefileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
  _vptr_basic_ostream = (_func_int **)psVar5->_M_string_length;
  makefileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0x15;
  makefileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
       anon_var_dwarf_1f7e678;
  views._M_len = 2;
  views._M_array = (iterator)&makefileStream;
  cmCatViews_abi_cxx11_(&makefileName,views);
  encoding = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
               [5])(this);
  cmGeneratedFileStream::cmGeneratedFileStream(&makefileStream,&makefileName,false,encoding);
  if (((&makefileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20
       )[(long)makefileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
               _vptr_basic_ostream[-3]] & 5) == 0) {
    this_00._M_t.super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
    super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl =
         (((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t;
    cmLocalUnixMakefileGenerator3::WriteDisclaimer
              ((cmLocalUnixMakefileGenerator3 *)
               this_00._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl,
               (ostream *)&makefileStream);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    no_commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    no_commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    no_commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[4]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
               (char (*) [4])0x74fe42);
    local_2f8._0_8_ = local_2f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"default_target","");
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              ((cmLocalUnixMakefileGenerator3 *)
               this_00._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl,
               (ostream *)&makefileStream,
               "Default target executed when no arguments are given to make.",(string *)local_2f8,
               &depends,&no_commands,true,false);
    if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
    pbVar4 = depends.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar3 = depends.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar8 = &(depends.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        plVar1 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (paVar8 + -1))->_M_dataplus)._M_p;
        if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)plVar1) {
          operator_delete(plVar1,paVar8->_M_allocated_capacity + 1);
        }
        pbVar9 = (pointer)(paVar8 + 1);
        paVar8 = paVar8 + 2;
      } while (pbVar9 != pbVar4);
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
    }
    if ((this->EmptyRuleHackDepends)._M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&depends,&this->EmptyRuleHackDepends);
    }
    cmLocalUnixMakefileGenerator3::WriteSpecialTargetsTop
              ((cmLocalUnixMakefileGenerator3 *)
               this_00._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl,
               (ostream *)&makefileStream);
    cmGlobalCommonGenerator::ComputeDirectoryTargets_abi_cxx11_
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
                *)local_2f8,&this->super_cmGlobalCommonGenerator);
    if ((_Rb_tree_node_base *)local_2f8._24_8_ != (_Rb_tree_node_base *)(local_2f8 + 8)) {
      p_Var6 = (_Rb_tree_node_base *)local_2f8._24_8_;
      do {
        WriteDirectoryRules2
                  (this,(ostream *)&makefileStream,
                   (cmLocalUnixMakefileGenerator3 *)
                   this_00._M_t.
                   super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                   .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl,
                   (DirectoryTarget *)(p_Var6 + 2));
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      } while (p_Var6 != (_Rb_tree_node_base *)(local_2f8 + 8));
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
                 *)local_2f8);
    puVar7 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar7 != puVar2) {
      do {
        WriteConvenienceRules2
                  (this,(ostream *)&makefileStream,
                   (cmLocalUnixMakefileGenerator3 *)
                   this_00._M_t.
                   super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                   .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl,
                   (cmLocalUnixMakefileGenerator3 *)
                   (puVar7->_M_t).
                   super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                   .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
        puVar7 = puVar7 + 1;
      } while (puVar7 != puVar2);
    }
    cmLocalUnixMakefileGenerator3::WriteSpecialTargetsBottom
              ((cmLocalUnixMakefileGenerator3 *)
               this_00._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl,
               (ostream *)&makefileStream);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&no_commands);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&depends);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&makefileStream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)makefileName._M_dataplus._M_p != &makefileName.field_2) {
    operator_delete(makefileName._M_dataplus._M_p,makefileName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteMainMakefile2()
{
  // Open the output file.  This should not be copy-if-different
  // because the check-build-system step compares the makefile time to
  // see if the build system must be regenerated.
  std::string makefileName =
    cmStrCat(this->GetCMakeInstance()->GetHomeOutputDirectory(),
             "/CMakeFiles/Makefile2");
  cmGeneratedFileStream makefileStream(makefileName, false,
                                       this->GetMakefileEncoding());
  if (!makefileStream) {
    return;
  }

  // The global dependency graph is expressed via the root local generator.
  auto& rootLG = cm::static_reference_cast<cmLocalUnixMakefileGenerator3>(
    this->LocalGenerators[0]);

  // Write the do not edit header.
  rootLG.WriteDisclaimer(makefileStream);

  // Write the main entry point target.  This must be the VERY first
  // target so that make with no arguments will run it.
  // Just depend on the all target to drive the build.
  std::vector<std::string> depends;
  std::vector<std::string> no_commands;
  depends.emplace_back("all");

  // Write the rule.
  rootLG.WriteMakeRule(makefileStream,
                       "Default target executed when no arguments are "
                       "given to make.",
                       "default_target", depends, no_commands, true);

  depends.clear();

  // The all and preinstall rules might never have any dependencies
  // added to them.
  if (!this->EmptyRuleHackDepends.empty()) {
    depends.push_back(this->EmptyRuleHackDepends);
  }

  // Write out the "special" stuff
  rootLG.WriteSpecialTargetsTop(makefileStream);

  // Write the directory level rules.
  for (auto const& it : this->ComputeDirectoryTargets()) {
    this->WriteDirectoryRules2(makefileStream, rootLG, it.second);
  }

  // Write the target convenience rules
  for (const auto& localGen : this->LocalGenerators) {
    this->WriteConvenienceRules2(
      makefileStream, rootLG,
      cm::static_reference_cast<cmLocalUnixMakefileGenerator3>(localGen));
  }

  // Write special bottom targets
  rootLG.WriteSpecialTargetsBottom(makefileStream);
}